

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

int xmlCopyChar(int len,xmlChar *out,int val)

{
  int iVar1;
  
  iVar1 = 0;
  if (-1 < val && out != (xmlChar *)0x0) {
    if (0x7f < val) {
      iVar1 = xmlCopyCharMultiByte(out,val);
      return iVar1;
    }
    *out = (xmlChar)val;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
xmlCopyChar(int len ATTRIBUTE_UNUSED, xmlChar *out, int val) {
    if ((out == NULL) || (val < 0)) return(0);
    /* the len parameter is ignored */
    if  (val >= 0x80) {
	return(xmlCopyCharMultiByte (out, val));
    }
    *out = val;
    return 1;
}